

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashtbl.c
# Opt level: O1

void test_hashtbl_set_get(void)

{
  cf_hashtbl_t *self;
  cf_size_t cVar1;
  int *piVar2;
  long lVar3;
  int values [4];
  int keys [4];
  int local_38 [4];
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0x567800001234;
  uStack_20 = 0xdef000009abc;
  local_38[0] = 1;
  local_38[1] = 2;
  local_38[2] = 3;
  local_38[3] = 4;
  self = cf_hashtbl_new(0xf,cb);
  lVar3 = 0;
  do {
    cf_hashtbl_set(self,(cf_void_t *)((long)&local_28 + lVar3),4,
                   (cf_void_t *)((long)local_38 + lVar3));
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  cVar1 = cf_hashtbl_size(self);
  if (cVar1 == 4) {
    lVar3 = 0;
    do {
      piVar2 = (int *)cf_hashtbl_get(self,(cf_void_t *)((long)&local_28 + lVar3),4);
      if (*piVar2 != *(int *)((long)local_38 + lVar3)) {
        __assert_fail("*(int*)cf_hashtbl_get(tbl, &keys[i], sizeof(int)) == values[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_hashtbl.c"
                      ,0x16,"void test_hashtbl_set_get()");
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x10);
    cf_hashtbl_delete(self);
    return;
  }
  __assert_fail("cf_hashtbl_size(tbl) == cnt",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_hashtbl.c"
                ,0x13,"void test_hashtbl_set_get()");
}

Assistant:

void test_hashtbl_set_get() {
    int keys[] = {0x1234, 0x5678, 0x9abc, 0xdef0};
    int values[] = {1, 2, 3, 4};
    cf_size_t i, cnt = 4;
    cf_hashtbl_t* tbl = cf_hashtbl_new(15, cb);
    for (i = 0; i < cnt; i++) {
        cf_hashtbl_set(tbl, &keys[i], sizeof(int), &values[i]);
    }

    cf_assert(cf_hashtbl_size(tbl) == cnt);

    for (i = 0; i < cnt; i++) {
        cf_assert(*(int*)cf_hashtbl_get(tbl, &keys[i], sizeof(int)) == values[i]);
    }
    cf_hashtbl_delete(tbl);
}